

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.cpp
# Opt level: O0

void CJobPool::WorkerThread(void *pUser)

{
  undefined4 uVar1;
  long in_RDI;
  CJob *pJob;
  CJobPool *pPool;
  undefined8 local_18;
  
  while (((*(byte *)(in_RDI + 0x108) ^ 0xff) & 1) != 0) {
    local_18 = 0;
    lock_wait((LOCK)0x14d8b6);
    if (*(long *)(in_RDI + 0x118) != 0) {
      local_18 = *(long *)(in_RDI + 0x118);
      *(undefined8 *)(in_RDI + 0x118) = *(undefined8 *)(*(long *)(in_RDI + 0x118) + 8);
      if (*(long *)(in_RDI + 0x118) == 0) {
        *(undefined8 *)(in_RDI + 0x120) = 0;
      }
      else {
        **(undefined8 **)(in_RDI + 0x118) = 0;
      }
    }
    lock_unlock((LOCK)0x14d938);
    if (local_18 == 0) {
      thread_sleep(0);
    }
    else {
      *(undefined4 *)(local_18 + 0x10) = 1;
      uVar1 = (**(code **)(local_18 + 0x18))(*(undefined8 *)(local_18 + 0x20));
      *(undefined4 *)(local_18 + 0x14) = uVar1;
      *(undefined4 *)(local_18 + 0x10) = 2;
    }
  }
  return;
}

Assistant:

void CJobPool::WorkerThread(void *pUser)
{
	CJobPool *pPool = (CJobPool *)pUser;

	while(!pPool->m_Shutdown)
	{
		CJob *pJob = 0;

		// fetch job from queue
		lock_wait(pPool->m_Lock);
		if(pPool->m_pFirstJob)
		{
			pJob = pPool->m_pFirstJob;
			pPool->m_pFirstJob = pPool->m_pFirstJob->m_pNext;
			if(pPool->m_pFirstJob)
				pPool->m_pFirstJob->m_pPrev = 0;
			else
				pPool->m_pLastJob = 0;
		}
		lock_unlock(pPool->m_Lock);

		// do the job if we have one
		if(pJob)
		{
			pJob->m_Status = CJob::STATE_RUNNING;
			pJob->m_Result = pJob->m_pfnFunc(pJob->m_pFuncData);
			pJob->m_Status = CJob::STATE_DONE;
		}
		else
			thread_sleep(10);
	}

}